

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O3

void __thiscall ProjectWriter::writeCurves(ProjectWriter *this)

{
  undefined1 *puVar1;
  pointer ppCVar2;
  Curve *pCVar3;
  long lVar4;
  long lVar5;
  char *__s;
  pointer pdVar6;
  ostream *poVar7;
  size_t sVar8;
  pointer ppCVar9;
  ulong uVar10;
  
  puVar1 = &this->field_0x18;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\n[CURVES]\n",10);
  ppCVar9 = (this->network->curves).super__Vector_base<Curve_*,_std::allocator<Curve_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar2 = (this->network->curves).super__Vector_base<Curve_*,_std::allocator<Curve_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppCVar9 == ppCVar2) {
      return;
    }
    pCVar3 = *ppCVar9;
    if (*(int *)&(pCVar3->super_Element).field_0x2c != 0) {
      lVar4 = *(long *)&this->field_0x18;
      lVar5 = *(long *)(lVar4 + -0x18);
      *(uint *)(&this->field_0x30 + lVar5) =
           *(uint *)(&this->field_0x30 + lVar5) & 0xffffff4f | 0x20;
      *(undefined8 *)(&this->field_0x28 + *(long *)(lVar4 + -0x18)) = 0x10;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)puVar1,(pCVar3->super_Element).name._M_dataplus._M_p,
                          (pCVar3->super_Element).name._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
      __s = Curve::CurveTypeWords[*(int *)&(pCVar3->super_Element).field_0x2c];
      if (__s == (char *)0x0) {
        std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
      }
      else {
        sVar8 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,__s,sVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    }
    if (0 < (int)((ulong)((long)(pCVar3->xData).super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(pCVar3->xData).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3)) {
      uVar10 = 0;
      do {
        *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 0x10;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)puVar1,(pCVar3->super_Element).name._M_dataplus._M_p,
                            (pCVar3->super_Element).name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
        *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 0xc;
        pdVar6 = (pCVar3->xData).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(pCVar3->xData).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pdVar6 >> 3) <= uVar10)
        {
LAB_0013d337:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar10);
        }
        std::ostream::_M_insert<double>(pdVar6[uVar10]);
        *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 0xc;
        pdVar6 = (pCVar3->yData).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(pCVar3->yData).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pdVar6 >> 3) <= uVar10)
        goto LAB_0013d337;
        poVar7 = std::ostream::_M_insert<double>(pdVar6[uVar10]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        uVar10 = uVar10 + 1;
      } while ((long)uVar10 <
               (long)(int)((ulong)((long)(pCVar3->xData).
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_finish -
                                  (long)(pCVar3->xData).
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start) >> 3));
    }
    ppCVar9 = ppCVar9 + 1;
  } while( true );
}

Assistant:

void ProjectWriter::writeCurves()
{
    fout << "\n[CURVES]\n";
    for (Curve* curve : network->curves)
    {
        if (curve->curveType() != Curve::UNKNOWN)
        {
            fout << left << setw(16) << curve->name << "  " <<
                Curve::CurveTypeWords[curve->curveType()] << "\n";
        }
        for (int i = 0; i < curve->size(); i++)
        {
            fout << setw(16) << curve->name << "  ";
            fout << setw(12) << curve->x(i);
            fout << setw(12) << curve->y(i) << "\n";
        }
    }
}